

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O2

uint8_t arangodb::velocypack::Builder::intLength(int64_t value)

{
  bool bVar1;
  uint8_t uVar2;
  ulong uVar3;
  
  uVar2 = '\x01';
  if ((char)value != value) {
    uVar3 = value >> 0x3f ^ value;
    do {
      uVar2 = uVar2 + '\x01';
      bVar1 = 0x7fff < uVar3;
      uVar3 = uVar3 >> 8;
    } while (bVar1);
  }
  return uVar2;
}

Assistant:

static inline uint8_t intLength(int64_t value) {
    if (value >= -0x80 && value <= 0x7f) {
      // shortcut for the common case
      return 1;
    }
    uint64_t x = value >= 0 ? static_cast<uint64_t>(value)
                            : static_cast<uint64_t>(-(value + 1));
    uint8_t xSize = 0;
    do {
      xSize++;
      x >>= 8;
    } while (x >= 0x80);
    return xSize + 1;
  }